

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O0

void jpeg_fdct_6x6(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  byte *pbVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  uint in_EDX;
  long in_RSI;
  int *in_RDI;
  int ctr;
  JSAMPROW elemptr;
  DCTELEM *dataptr;
  INT32 tmp12;
  INT32 tmp11;
  INT32 tmp10;
  INT32 tmp2;
  INT32 tmp1;
  INT32 tmp0;
  int local_5c;
  int *local_50;
  
  memset(in_RDI,0,0x100);
  local_50 = in_RDI;
  for (local_5c = 0; local_5c < 6; local_5c = local_5c + 1) {
    pbVar9 = (byte *)(*(long *)(in_RSI + (long)local_5c * 8) + (ulong)in_EDX);
    bVar1 = *pbVar9;
    bVar2 = pbVar9[5];
    iVar5 = (uint)pbVar9[1] + (uint)pbVar9[4];
    bVar3 = pbVar9[2];
    bVar4 = pbVar9[3];
    lVar10 = (long)(int)((uint)bVar1 + (uint)bVar2) + (long)(int)((uint)bVar3 + (uint)bVar4);
    iVar6 = (uint)*pbVar9 - (uint)pbVar9[5];
    iVar7 = (uint)pbVar9[1] - (uint)pbVar9[4];
    iVar8 = (uint)pbVar9[2] - (uint)pbVar9[3];
    *local_50 = ((int)lVar10 + iVar5 + -0x300) * 4;
    local_50[2] = (int)(((long)(int)((uint)bVar1 + (uint)bVar2) -
                        (long)(int)((uint)bVar3 + (uint)bVar4)) * 0x2731 + 0x400 >> 0xb);
    local_50[4] = (int)(((lVar10 - iVar5) - (long)iVar5) * 0x16a1 + 0x400 >> 0xb);
    iVar5 = (int)(((long)iVar6 + (long)iVar8) * 0xbb6 + 0x400 >> 0xb);
    local_50[1] = iVar5 + (iVar6 + iVar7) * 4;
    local_50[3] = ((iVar6 - iVar7) - iVar8) * 4;
    local_50[5] = iVar5 + (iVar8 - iVar7) * 4;
    local_50 = local_50 + 8;
  }
  local_50 = in_RDI;
  for (local_5c = 0; local_5c < 6; local_5c = local_5c + 1) {
    iVar5 = *local_50;
    lVar10 = (long)(local_50[8] + local_50[0x20]);
    lVar11 = (long)(iVar5 + local_50[0x28]) + (long)(local_50[0x10] + local_50[0x18]);
    lVar12 = (long)(*local_50 - local_50[0x28]);
    lVar13 = (long)(local_50[8] - local_50[0x20]);
    lVar14 = (long)(local_50[0x10] - local_50[0x18]);
    *local_50 = (int)((lVar11 + lVar10) * 0x38e4 + 0x4000 >> 0xf);
    local_50[0x10] =
         (int)(((long)(iVar5 + local_50[0x28]) - (long)(local_50[0x10] + local_50[0x18])) * 0x45ad +
               0x4000 >> 0xf);
    local_50[0x20] = (int)(((lVar11 - lVar10) - lVar10) * 0x283a + 0x4000 >> 0xf);
    lVar10 = (lVar12 + lVar14) * 0x14d3;
    local_50[8] = (int)(lVar10 + (lVar12 + lVar13) * 0x38e4 + 0x4000 >> 0xf);
    local_50[0x18] = (int)(((lVar12 - lVar13) - lVar14) * 0x38e4 + 0x4000 >> 0xf);
    local_50[0x28] = (int)(lVar10 + (lVar14 - lVar13) * 0x38e4 + 0x4000 >> 0xf);
    local_50 = local_50 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_6x6 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2;
  INT32 tmp10, tmp11, tmp12;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* cK represents sqrt(2) * cos(K*pi/12). */

  dataptr = data;
  for (ctr = 0; ctr < 6; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[5]);
    tmp11 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[4]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[3]);

    tmp10 = tmp0 + tmp2;
    tmp12 = tmp0 - tmp2;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[5]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[4]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[3]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp10 + tmp11 - 6 * CENTERJSAMPLE) << PASS1_BITS);
    dataptr[2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp12, FIX(1.224744871)),                 /* c2 */
	      CONST_BITS-PASS1_BITS);
    dataptr[4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp11 - tmp11, FIX(0.707106781)), /* c4 */
	      CONST_BITS-PASS1_BITS);

    /* Odd part */

    tmp10 = DESCALE(MULTIPLY(tmp0 + tmp2, FIX(0.366025404)),     /* c5 */
		    CONST_BITS-PASS1_BITS);

    dataptr[1] = (DCTELEM) (tmp10 + ((tmp0 + tmp1) << PASS1_BITS));
    dataptr[3] = (DCTELEM) ((tmp0 - tmp1 - tmp2) << PASS1_BITS);
    dataptr[5] = (DCTELEM) (tmp10 + ((tmp2 - tmp1) << PASS1_BITS));

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by (8/6)**2 = 16/9, which we fold
   * into the constant multipliers:
   * cK now represents sqrt(2) * cos(K*pi/12) * 16/9.
   */

  dataptr = data;
  for (ctr = 0; ctr < 6; ctr++) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*5];
    tmp11 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] + dataptr[DCTSIZE*3];

    tmp10 = tmp0 + tmp2;
    tmp12 = tmp0 - tmp2;

    tmp0 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*5];
    tmp1 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] - dataptr[DCTSIZE*3];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 + tmp11, FIX(1.777777778)),         /* 16/9 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(MULTIPLY(tmp12, FIX(2.177324216)),                 /* c2 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp11 - tmp11, FIX(1.257078722)), /* c4 */
	      CONST_BITS+PASS1_BITS);

    /* Odd part */

    tmp10 = MULTIPLY(tmp0 + tmp2, FIX(0.650711829));             /* c5 */

    dataptr[DCTSIZE*1] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp0 + tmp1, FIX(1.777777778)),   /* 16/9 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*3] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 - tmp1 - tmp2, FIX(1.777777778)),    /* 16/9 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*5] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp2 - tmp1, FIX(1.777777778)),   /* 16/9 */
	      CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}